

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-stop.c
# Opt level: O0

int run_test_loop_stop(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  int r;
  
  puVar2 = uv_default_loop();
  uv_prepare_init(puVar2,&prepare_handle);
  uv_prepare_start(&prepare_handle,prepare_cb);
  puVar2 = uv_default_loop();
  uv_timer_init(puVar2,&timer_handle);
  uv_timer_start(&timer_handle,timer_cb,100,100);
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-stop.c"
            ,0x3a,"r != 0");
    abort();
  }
  if (timer_called != 1) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-stop.c"
            ,0x3b,"timer_called == 1");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_NOWAIT);
  if (iVar1 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-stop.c"
            ,0x3e,"r != 0");
    abort();
  }
  if (prepare_called < 2) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-stop.c"
            ,0x3f,"prepare_called > 1");
    abort();
  }
  puVar2 = uv_default_loop();
  iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-stop.c"
            ,0x42,"r == 0");
    abort();
  }
  if (timer_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-stop.c"
            ,0x43,"timer_called == 10");
    abort();
  }
  if (prepare_called != 10) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-stop.c"
            ,0x44,"prepare_called == 10");
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(loop_stop) {
  int r;
  uv_prepare_init(uv_default_loop(), &prepare_handle);
  uv_prepare_start(&prepare_handle, prepare_cb);
  uv_timer_init(uv_default_loop(), &timer_handle);
  uv_timer_start(&timer_handle, timer_cb, 100, 100);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r != 0);
  ASSERT(timer_called == 1);

  r = uv_run(uv_default_loop(), UV_RUN_NOWAIT);
  ASSERT(r != 0);
  ASSERT(prepare_called > 1);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(timer_called == 10);
  ASSERT(prepare_called == 10);

  return 0;
}